

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * exprINAffinity(Parse *pParse,Expr *pExpr)

{
  Select *pVector;
  int iVar1;
  u8 uVar2;
  char aff2;
  char *pcVar3;
  Expr *pExpr_00;
  Select *pSVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  pVector = (Select *)pExpr->pLeft;
  uVar2 = pVector->op;
  if (uVar2 == 0xb0) {
    uVar2 = *(u8 *)&pVector->nSelectRow;
  }
  pSVar4 = pVector;
  if (uVar2 != 0xb1) {
    uVar6 = 1;
    if (uVar2 != 0x8b) goto LAB_0017d997;
    pSVar4 = ((anon_union_8_2_a01b6dbf_for_x *)&pVector->pEList)->pSelect;
  }
  uVar6 = (ulong)(uint)((anon_union_8_2_a01b6dbf_for_x *)&pSVar4->pEList)->pList->nExpr;
LAB_0017d997:
  if ((pExpr->flags & 0x1000) == 0) {
    pSVar4 = (Select *)0x0;
  }
  else {
    pSVar4 = (pExpr->x).pSelect;
  }
  iVar1 = (int)uVar6;
  if (pParse->db == (sqlite3 *)0x0) {
    pcVar3 = (char *)sqlite3Malloc((long)(iVar1 + 1));
  }
  else {
    pcVar3 = (char *)sqlite3DbMallocRawNN(pParse->db,(long)(iVar1 + 1));
  }
  if (pcVar3 != (char *)0x0) {
    if (0 < iVar1) {
      lVar5 = 8;
      uVar7 = 0;
      do {
        pExpr_00 = sqlite3VectorFieldSubexpr((Expr *)pVector,(int)uVar7);
        aff2 = sqlite3ExprAffinity(pExpr_00);
        if (pSVar4 != (Select *)0x0) {
          aff2 = sqlite3CompareAffinity(*(Expr **)((long)pSVar4->pEList->a + lVar5 + -8),aff2);
        }
        pcVar3[uVar7] = aff2;
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x18;
      } while (uVar6 != uVar7);
    }
    pcVar3[iVar1] = '\0';
  }
  return pcVar3;
}

Assistant:

static char *exprINAffinity(Parse *pParse, const Expr *pExpr){
  Expr *pLeft = pExpr->pLeft;
  int nVal = sqlite3ExprVectorSize(pLeft);
  Select *pSelect = ExprUseXSelect(pExpr) ? pExpr->x.pSelect : 0;
  char *zRet;

  assert( pExpr->op==TK_IN );
  zRet = sqlite3DbMallocRaw(pParse->db, nVal+1);
  if( zRet ){
    int i;
    for(i=0; i<nVal; i++){
      Expr *pA = sqlite3VectorFieldSubexpr(pLeft, i);
      char a = sqlite3ExprAffinity(pA);
      if( pSelect ){
        zRet[i] = sqlite3CompareAffinity(pSelect->pEList->a[i].pExpr, a);
      }else{
        zRet[i] = a;
      }
    }
    zRet[nVal] = '\0';
  }
  return zRet;
}